

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O3

void ERR_put_error(int lib,int func,int reason,char *file,int line)

{
  char **ppcVar1;
  uint uVar2;
  uint uVar3;
  ERR_STATE *pEVar4;
  uint *puVar5;
  
  pEVar4 = err_get_state();
  if (pEVar4 != (ERR_STATE *)0x0) {
    if (lib == 2 && reason == 0) {
      puVar5 = (uint *)__errno_location();
      reason = *puVar5;
    }
    uVar2 = pEVar4->top;
    uVar3 = uVar2 + 1 & 0xf;
    pEVar4->top = uVar3;
    if (uVar3 == pEVar4->bottom) {
      pEVar4->bottom = uVar2 + 2 & 0xf;
    }
    free(pEVar4->errors[uVar3].data);
    ppcVar1 = &pEVar4->errors[uVar3].data;
    *ppcVar1 = (char *)0x0;
    ppcVar1[1] = (char *)0x0;
    pEVar4->errors[uVar3].file = file;
    pEVar4->errors[uVar3].line = (uint16_t)line;
    pEVar4->errors[uVar3].packed = reason & 0xfffU | lib << 0x18;
  }
  return;
}

Assistant:

void ERR_put_error(int library, int unused, int reason, const char *file,
                   unsigned line) {
  ERR_STATE *const state = err_get_state();
  struct err_error_st *error;

  if (state == NULL) {
    return;
  }

  if (library == ERR_LIB_SYS && reason == 0) {
#if defined(OPENSSL_WINDOWS)
    reason = GetLastError();
#else
    reason = errno;
#endif
  }

  state->top = (state->top + 1) % ERR_NUM_ERRORS;
  if (state->top == state->bottom) {
    state->bottom = (state->bottom + 1) % ERR_NUM_ERRORS;
  }

  error = &state->errors[state->top];
  err_clear(error);
  error->file = file;
  error->line = line;
  error->packed = ERR_PACK(library, reason);
}